

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkMissedBreak(CheckerVisitor *this,SwitchStatement *swtch)

{
  ArenaVector<SQCompilation::SwitchCase> *this_00;
  TreeOp TVar1;
  const_iterator pSVar2;
  Node *this_01;
  Block *effectiveSize;
  SwitchCase *pSVar3;
  SwitchStatement *in_RSI;
  CheckerVisitor *in_RDI;
  Statement *tmp;
  int32_t dummy;
  Block *b;
  TreeOp op;
  Statement *uw;
  bool r;
  Statement *stmt;
  SwitchCase *c;
  const_iterator __end1;
  const_iterator __begin1;
  ArenaVector<SQCompilation::SwitchCase> *__range1;
  Statement *last;
  FunctionReturnTypeEvaluator rtEvaluator;
  ArenaVector<SQCompilation::SwitchCase> *cases;
  Statement *in_stack_ffffffffffffff68;
  Node *in_stack_ffffffffffffff78;
  FunctionReturnTypeEvaluator *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff90;
  const_iterator local_40;
  Node *local_30;
  FunctionReturnTypeEvaluator local_28;
  ArenaVector<SQCompilation::SwitchCase> *local_18;
  SwitchStatement *local_10;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    local_10 = in_RSI;
    local_18 = SwitchStatement::cases(in_RSI);
    FunctionReturnTypeEvaluator::FunctionReturnTypeEvaluator(&local_28,in_RDI);
    this_00 = local_18;
    local_30 = (Node *)0x0;
    local_40 = ArenaVector<SQCompilation::SwitchCase>::begin(local_18);
    pSVar2 = ArenaVector<SQCompilation::SwitchCase>::end(this_00);
    for (; local_40 != pSVar2; local_40 = local_40 + 1) {
      if (local_30 != (Node *)0x0) {
        report(in_RDI,local_30,0x72);
      }
      local_30 = (Node *)0x0;
      FunctionReturnTypeEvaluator::compute
                (in_stack_ffffffffffffff80,(Statement *)in_stack_ffffffffffffff78,(bool *)in_RDI);
      this_01 = &unwrapBodyNonEmpty((Statement *)in_stack_ffffffffffffff78)->super_Node;
      if (this_01 != (Node *)0x0) {
        TVar1 = Node::op(this_01);
        if (TVar1 == TO_BLOCK) {
          effectiveSize = Statement::asBlock((Statement *)this_01);
          in_stack_ffffffffffffff78 =
               &lastNonEmpty((Block *)CONCAT44(TVar1,in_stack_ffffffffffffff90),
                             (int32_t *)effectiveSize)->super_Node;
          if ((in_stack_ffffffffffffff78 != (Node *)0x0) &&
             (TVar1 = Node::op(in_stack_ffffffffffffff78), TVar1 != TO_BREAK)) {
            local_30 = &unwrapBody(in_stack_ffffffffffffff68)->super_Node;
          }
        }
        else if (TVar1 != TO_BREAK) {
          local_30 = &unwrapBody(in_stack_ffffffffffffff68)->super_Node;
        }
      }
    }
    if ((local_30 != (Node *)0x0) &&
       (pSVar3 = SwitchStatement::defaultCase(local_10), pSVar3->stmt != (Statement *)0x0)) {
      report(in_RDI,local_30,0x72);
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkMissedBreak(const SwitchStatement *swtch) {
  if (effectsOnly)
    return;

  auto &cases = swtch->cases();

  FunctionReturnTypeEvaluator rtEvaluator(this);

  const Statement *last = nullptr;
  for (auto &c : cases) {

    if (last) {
      report(last, DiagnosticsId::DI_MISSED_BREAK);
    }
    last = nullptr;

    const Statement *stmt = c.stmt;
    bool r = false;
    rtEvaluator.compute(stmt, r);
    if (!r) {
      const Statement *uw = unwrapBodyNonEmpty(stmt);

      if (!uw)
        continue; // empty case statement -> FT

      const enum TreeOp op = uw->op();
      if (op != TO_BLOCK) {
        if (op != TO_BREAK)
          last = unwrapBody(stmt);
      }
      else {
        const Block *b = uw->asBlock();
        int32_t dummy;
        const Statement *tmp = lastNonEmpty(b, dummy);
        if (tmp && tmp->op() != TO_BREAK) {
          last = unwrapBody(b);
        }
      }
    }
  }

  if (last && swtch->defaultCase().stmt) {
    /*
      switch (x) {
        case A:
          ...
          break;

        case B:
          ...   <-- missed break
        default:
          ...
      }
    */
    report(last, DiagnosticsId::DI_MISSED_BREAK);
  }
}